

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.hpp
# Opt level: O3

basic_bigint<std::allocator<unsigned_char>_> *
jsoncons::operator-(basic_bigint<std::allocator<unsigned_char>_> *__return_storage_ptr__,
                   basic_bigint<std::allocator<unsigned_char>_> *x,int64_t y)

{
  basic_bigint<std::allocator<unsigned_char>_> *n;
  basic_bigint<std::allocator<unsigned_char>_> local_40;
  
  local_40.field_0._0_1_ = (byte)((ulong)y >> 0x3e) & 2;
  local_40.field_0.common_stor_.length_ = (size_type)(y != 0);
  local_40.field_0.short_stor_.values_[0] = -y;
  if (0 < y) {
    local_40.field_0.short_stor_.values_[0] = y;
  }
  local_40.field_0.short_stor_.values_[1] = 0;
  n = basic_bigint<std::allocator<unsigned_char>_>::operator-=(x,&local_40);
  basic_bigint<std::allocator<unsigned_char>_>::basic_bigint(__return_storage_ptr__,n);
  if (((local_40.field_0._0_1_ & 1) != 0) &&
     ((pointer)local_40.field_0.short_stor_.values_[1] != (pointer)0x0)) {
    operator_delete(local_40.field_0.dynamic_stor_.data_,
                    local_40.field_0.short_stor_.values_[0] << 3);
  }
  return __return_storage_ptr__;
}

Assistant:

friend basic_bigint<Allocator> operator-( basic_bigint<Allocator> x, int64_t y )
    {
        return x -= y;
    }